

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void reset(int size)

{
  bool bVar1;
  reference ppMVar2;
  reference ppPVar3;
  value_type local_78;
  MemBlock *free;
  Process *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  list<Process_*,_std::allocator<Process_*>_> *__range1_2;
  MemBlock *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1_1;
  MemBlock *i;
  iterator __end1;
  iterator __begin1;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1;
  int size_local;
  
  memSize = size;
  __end1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                     (&usedMemBlockList_abi_cxx11_);
  i = (MemBlock *)
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end(&usedMemBlockList_abi_cxx11_)
  ;
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    ppMVar2 = std::_List_iterator<MemBlock_*>::operator*(&__end1);
    if (*ppMVar2 != (MemBlock *)0x0) {
      operator_delete(*ppMVar2);
    }
    std::_List_iterator<MemBlock_*>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                       (&freeMemBlockList_abi_cxx11_);
  i_1 = (MemBlock *)
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end
                  (&freeMemBlockList_abi_cxx11_);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&i_1);
    if (!bVar1) break;
    ppMVar2 = std::_List_iterator<MemBlock_*>::operator*(&__end1_1);
    if (*ppMVar2 != (MemBlock *)0x0) {
      operator_delete(*ppMVar2);
    }
    std::_List_iterator<MemBlock_*>::operator++(&__end1_1);
  }
  __end1_2 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::begin
                       (&processList_abi_cxx11_);
  i_2 = (Process *)
        std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::end(&processList_abi_cxx11_);
  while( true ) {
    bVar1 = std::operator!=(&__end1_2,(_Self *)&i_2);
    if (!bVar1) break;
    ppPVar3 = std::_List_iterator<Process_*>::operator*(&__end1_2);
    free = (MemBlock *)*ppPVar3;
    if ((Process *)free != (Process *)0x0) {
      operator_delete(free);
    }
    std::_List_iterator<Process_*>::operator++(&__end1_2);
  }
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::clear(&usedMemBlockList_abi_cxx11_);
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::clear(&freeMemBlockList_abi_cxx11_);
  std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::clear(&processList_abi_cxx11_);
  local_78 = (value_type)operator_new(8);
  local_78->start = 0;
  local_78->length = memSize;
  std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
            (&freeMemBlockList_abi_cxx11_,&local_78);
  return;
}

Assistant:

void reset(int size) {
    // 首先将内存大小设置为size
    memSize = size;

    // 清空所有链表
    for (MemBlock *i : usedMemBlockList) delete i;
    for (MemBlock *i : freeMemBlockList) delete i;
    for (Process *i : processList) delete i;
    usedMemBlockList.clear();
    freeMemBlockList.clear();
    processList.clear();

    // 添加一块大小为size的空内存至链表
    MemBlock *free = new MemBlock;
    free->start = 0;
    free->length = memSize;
    freeMemBlockList.push_back(free);
}